

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorElement.cpp
# Opt level: O2

void __thiscall
iDynTree::SensorElement::SensorElement
          (SensorElement *this,XMLParserState *parserState,
          vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
          *sensors)

{
  allocator<char> local_79;
  string local_78 [96];
  
  std::__cxx11::string::string<std::allocator<char>>(local_78,"sensor",&local_79);
  iDynTree::XMLElement::XMLElement(&this->super_XMLElement,parserState,local_78);
  std::__cxx11::string::~string(local_78);
  *(undefined ***)this = &PTR__SensorElement_00151458;
  std::make_shared<iDynTree::SensorElement::SensorInfo>();
  this->m_sensors = sensors;
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=
            (&((this->m_info).
               super___shared_ptr<iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_origin,(Transform *)local_78);
  return;
}

Assistant:

SensorElement::SensorElement(
        XMLParserState& parserState, 
        std::vector<std::shared_ptr<SensorHelper>>& sensors)
    : iDynTree::XMLElement(parserState, "sensor")
    , m_info(std::make_shared<SensorInfo>())
    , m_sensors(sensors)
    {
        // Defaulting the origin
        m_info->m_origin = Transform::Identity();
    }